

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void scas_(PDISASM pMyDisasm)

{
  PDISASM pMyDisasm_local;
  
  if ((pMyDisasm->Prefix).RepnePrefix == '\x02') {
    (pMyDisasm->Prefix).RepnePrefix = '\x01';
  }
  if ((pMyDisasm->Prefix).RepPrefix == '\x02') {
    (pMyDisasm->Prefix).RepPrefix = '\x01';
  }
  (pMyDisasm->Instruction).Category = 0x10007;
  if ((pMyDisasm->Reserved_).OperandSize == 0x40) {
    strcpy((pMyDisasm->Instruction).Mnemonic,"scasq");
    (pMyDisasm->Operand1).OpType = 0x20000;
    (pMyDisasm->Operand1).Registers.type = 1;
    (pMyDisasm->Operand1).Registers.gpr = 1;
    (pMyDisasm->Operand1).OpSize = 0x40;
    (pMyDisasm->Operand1).AccessMode = 1;
    (pMyDisasm->Operand2).OpType = 0x30000;
    (pMyDisasm->Operand2).Memory.BaseRegister = 0x80;
    (pMyDisasm->Operand2).OpSize = 0x40;
    (pMyDisasm->Instruction).ImplicitModifiedRegs.type = 1;
    (pMyDisasm->Instruction).ImplicitModifiedRegs.gpr = 0x80;
    (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 1;
    FillFlags(pMyDisasm,0x5e);
  }
  else if ((pMyDisasm->Reserved_).OperandSize == 0x20) {
    strcpy((pMyDisasm->Instruction).Mnemonic,"scasd");
    (pMyDisasm->Operand1).OpType = 0x20000;
    (pMyDisasm->Operand1).Registers.type = 1;
    (pMyDisasm->Operand1).Registers.gpr = 1;
    (pMyDisasm->Operand1).OpSize = 0x20;
    (pMyDisasm->Operand1).AccessMode = 1;
    (pMyDisasm->Operand2).OpType = 0x30000;
    (pMyDisasm->Operand2).Memory.BaseRegister = 0x80;
    (pMyDisasm->Operand2).OpSize = 0x20;
    (pMyDisasm->Instruction).ImplicitModifiedRegs.type = 1;
    (pMyDisasm->Instruction).ImplicitModifiedRegs.gpr = 0x80;
    (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 1;
    FillFlags(pMyDisasm,0x5e);
  }
  else {
    strcpy((pMyDisasm->Instruction).Mnemonic,"scasw");
    (pMyDisasm->Operand1).OpType = 0x20000;
    (pMyDisasm->Operand1).Registers.type = 1;
    (pMyDisasm->Operand1).Registers.gpr = 1;
    (pMyDisasm->Operand1).OpSize = 0x10;
    (pMyDisasm->Operand1).AccessMode = 1;
    (pMyDisasm->Operand2).OpType = 0x30000;
    (pMyDisasm->Operand2).Memory.BaseRegister = 0x80;
    (pMyDisasm->Operand2).OpSize = 0x10;
    (pMyDisasm->Instruction).ImplicitModifiedRegs.type = 1;
    (pMyDisasm->Instruction).ImplicitModifiedRegs.gpr = 0x80;
    (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 1;
    FillFlags(pMyDisasm,0x5e);
  }
  return;
}

Assistant:

void __bea_callspec__ scas_(PDISASM pMyDisasm)
{
    if (pMyDisasm->Prefix.RepnePrefix == SuperfluousPrefix) {
        pMyDisasm->Prefix.RepnePrefix = InUsePrefix;
    }
    if (pMyDisasm->Prefix.RepPrefix == SuperfluousPrefix) {
        pMyDisasm->Prefix.RepPrefix = InUsePrefix;
    }
    pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+STRING_INSTRUCTION;
    if (GV.OperandSize == 64) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "scasq");
        #endif
        pMyDisasm->Operand1.OpType = REGISTER_TYPE;
  pMyDisasm->Operand1.Registers.type = GENERAL_REG;
  pMyDisasm->Operand1.Registers.gpr = REG0;
        pMyDisasm->Operand1.OpSize = 64;
        pMyDisasm->Operand1.AccessMode = READ;
        pMyDisasm->Operand2.OpType = MEMORY_TYPE;
        pMyDisasm->Operand2.Memory.BaseRegister = REG7;
        pMyDisasm->Operand2.OpSize = 64;
        pMyDisasm->Instruction.ImplicitModifiedRegs.type = GENERAL_REG;
        pMyDisasm->Instruction.ImplicitModifiedRegs.gpr = REG7;
        GV.EIP_++;
        FillFlags(pMyDisasm, 94);
    }
    else if (GV.OperandSize == 32) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "scasd");
        #endif
        pMyDisasm->Operand1.OpType = REGISTER_TYPE;
  pMyDisasm->Operand1.Registers.type = GENERAL_REG;
  pMyDisasm->Operand1.Registers.gpr = REG0;
        pMyDisasm->Operand1.OpSize = 32;
        pMyDisasm->Operand1.AccessMode = READ;
        pMyDisasm->Operand2.OpType = MEMORY_TYPE;
        pMyDisasm->Operand2.Memory.BaseRegister = REG7;
        pMyDisasm->Operand2.OpSize = 32;
        pMyDisasm->Instruction.ImplicitModifiedRegs.type = GENERAL_REG;
        pMyDisasm->Instruction.ImplicitModifiedRegs.gpr = REG7;
        GV.EIP_++;
        FillFlags(pMyDisasm, 94);
    }
    else {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "scasw");
        #endif
        pMyDisasm->Operand1.OpType = REGISTER_TYPE;
  pMyDisasm->Operand1.Registers.type = GENERAL_REG;
  pMyDisasm->Operand1.Registers.gpr = REG0;
        pMyDisasm->Operand1.OpSize = 16;
        pMyDisasm->Operand1.AccessMode = READ;
        pMyDisasm->Operand2.OpType = MEMORY_TYPE;
        pMyDisasm->Operand2.Memory.BaseRegister = REG7;
        pMyDisasm->Operand2.OpSize = 16;
        pMyDisasm->Instruction.ImplicitModifiedRegs.type = GENERAL_REG;
        pMyDisasm->Instruction.ImplicitModifiedRegs.gpr = REG7;
        GV.EIP_++;
        FillFlags(pMyDisasm, 94);
    }
}